

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerThread.cpp
# Opt level: O2

void __thiscall PathTracerThread::Launch(PathTracerThread *this)

{
  PathTracer *this_00;
  PathTracerViewer *this_01;
  double dVar1;
  code *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  thread local_38;
  
  if ((this->m_viewer_thread)._M_id._M_thread == 0 &&
      (this->m_path_tracer_thread)._M_id._M_thread == 0) {
    LOCK();
    (this->m_run)._M_base._M_i = true;
    UNLOCK();
    LOCK();
    (this->m_pause)._M_base._M_i = false;
    UNLOCK();
    this->m_spp = 0;
    dVar1 = glfwGetTime();
    this->m_time = dVar1;
    this_00 = (((this->m_path_tracer_viewer_ptr).
                super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_path_tracer_ptr).super___shared_ptr<PathTracer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    myvk::CommandPool::Create((CommandPool *)&local_50,&this->m_path_tracer_queue,0);
    PathTracer::Reset(this_00,(shared_ptr<myvk::CommandPool> *)&local_50,&this->m_main_queue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    this_01 = (this->m_path_tracer_viewer_ptr).
              super___shared_ptr<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    myvk::CommandPool::Create((CommandPool *)&local_50,&this->m_main_queue,0);
    PathTracerViewer::Reset(this_01,(shared_ptr<myvk::CommandPool> *)&local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    local_50 = path_tracer_thread_func;
    local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    std::thread::thread<void(PathTracerThread::*)(),PathTracerThread*,void>
              (&local_38,(type *)&local_50,(PathTracerThread **)&local_40);
    std::thread::operator=(&this->m_path_tracer_thread,&local_38);
    std::thread::~thread(&local_38);
    local_50 = viewer_thread_func;
    local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
    std::thread::thread<void(PathTracerThread::*)(),PathTracerThread*,void>
              (&local_38,(type *)&local_50,(PathTracerThread **)&local_40);
    std::thread::operator=(&this->m_viewer_thread,&local_38);
    std::thread::~thread(&local_38);
  }
  return;
}

Assistant:

void PathTracerThread::StopAndJoin() {
	if (!IsRunning())
		return;

	m_pause.store(false, std::memory_order_release);
	m_run.store(false, std::memory_order_release);

	spdlog::debug("m_viewer_semaphore signal");
	m_viewer_semaphore.signal();
	spdlog::debug("m_pause_semaphore signal");
	m_pause_semaphore.signal();

	m_path_tracer_thread.join();
	m_viewer_thread.join();
}